

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

bool __thiscall QWizardPrivate::buttonLayoutContains(QWizardPrivate *this,WizardButton which)

{
  long lVar1;
  WizardButton *pWVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = true;
  if (this->buttonsHaveCustomLayout == true) {
    lVar3 = (this->buttonsCustomLayout).d.size;
    if (lVar3 == 0) {
      return false;
    }
    lVar4 = 0;
    do {
      if (lVar3 << 2 == lVar4) {
        return false;
      }
      lVar1 = lVar4 + 4;
      pWVar2 = (WizardButton *)((long)(this->buttonsCustomLayout).d.ptr + lVar4);
      lVar4 = lVar1;
    } while (*pWVar2 != which);
    bVar5 = lVar1 != 0;
  }
  return bVar5;
}

Assistant:

bool QWizardPrivate::buttonLayoutContains(QWizard::WizardButton which)
{
    return !buttonsHaveCustomLayout || buttonsCustomLayout.contains(which);
}